

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_public.c
# Opt level: O2

void nhr_request_set_url(nhr_request request,char *scheme,char *host,char *path,unsigned_short port)

{
  char *pcVar1;
  
  if (request != (nhr_request)0x0) {
    nhr_string_delete(request->scheme);
    pcVar1 = nhr_string_copy(scheme);
    request->scheme = pcVar1;
    nhr_string_delete(request->host);
    pcVar1 = nhr_string_copy(host);
    request->host = pcVar1;
    nhr_string_delete(request->path);
    pcVar1 = nhr_string_copy(path);
    request->path = pcVar1;
    request->port = port;
  }
  return;
}

Assistant:

void nhr_request_set_url(nhr_request request,
						 const char * scheme,
						 const char * host,
						 const char * path,
						 const unsigned short port) {
	if (request) {
		nhr_string_delete(request->scheme);
		request->scheme = nhr_string_copy(scheme);
		
		nhr_string_delete(request->host);
		request->host = nhr_string_copy(host);
		
		nhr_string_delete(request->path);
		request->path = nhr_string_copy(path);
		
		request->port = port;
	}
}